

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FieldOptions_EditionDefault * __thiscall
google::protobuf::FieldOptions_EditionDefault::operator=
          (FieldOptions_EditionDefault *this,FieldOptions_EditionDefault *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  FieldOptions_EditionDefault *from_local;
  FieldOptions_EditionDefault *this_local;
  
  if (this != from) {
    lhs = MessageLite::GetArena((MessageLite *)this);
    rhs = MessageLite::GetArena((MessageLite *)from);
    bVar1 = internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline FieldOptions_EditionDefault& operator=(FieldOptions_EditionDefault&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }